

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O0

bool_t DataToString(tchar_t *Value,size_t ValueLen,void *Data,size_t Size,dataflags Type)

{
  ulong local_50;
  size_t i;
  cc_fraction f;
  dataflags Type_local;
  size_t Size_local;
  void *Data_local;
  size_t ValueLen_local;
  tchar_t *Value_local;
  
  f.Den = Type;
  Type_local = Size;
  if (Size == 0) {
    Type_local = NodeTypeSize(Type);
  }
  if ((f.Den & 0x100U) != 0) {
    if ((f.Den & 0x3fU) == 4) {
      if (*Data == '\0') {
        return 0;
      }
    }
    else {
      for (local_50 = 0; (local_50 < Type_local && (*(char *)((long)Data + local_50) == '\0'));
          local_50 = local_50 + 1) {
      }
      if (local_50 == Type_local) {
        return 0;
      }
    }
  }
  *Value = '\0';
  switch((uint)f.Den & 0x3f) {
  case 1:
  case 0x18:
    IntToString(Value,ValueLen,(int32_t)*Data,0);
    break;
  case 2:
    if ((f.Den & 0x1f000000U) == 0xf000000) {
      i = (size_t)*Data;
      f.Num = 0x400;
      FractionToString(Value,ValueLen,(cc_fraction *)&i,-1,1);
    }
    else {
      IntToString(Value,ValueLen,*Data,0);
    }
    break;
  case 3:
    if ((f.Den & 0x1f000000U) == 0xf000000) {
      FractionToString(Value,ValueLen,(cc_fraction *)Data,-1,2);
    }
    else {
      stprintf_s(Value,ValueLen,"%d:%d",*Data,*(undefined8 *)((long)Data + 8));
    }
    break;
  case 4:
    tcscpy_s(Value,ValueLen,(tchar_t *)Data);
    break;
  case 5:
    stprintf_s(Value,ValueLen,"%d,%d,%d,%d",(ulong)*Data,(ulong)*(uint *)((long)Data + 4),
               (ulong)*(uint *)((long)Data + 8),*(undefined4 *)((long)Data + 0xc));
    break;
  case 6:
    stprintf_s(Value,ValueLen,"%d,%d",(ulong)*Data,(ulong)*(uint *)((long)Data + 4));
    break;
  case 7:
    RGBToString(Value,ValueLen,*Data);
    break;
  case 8:
    FourCCToString(Value,ValueLen,*Data);
    break;
  case 10:
    NodeToString(Value,ValueLen,*Data);
    break;
  case 0x10:
    for (local_50 = 0; local_50 < Type_local; local_50 = local_50 + 1) {
      stcatprintf_s(Value,ValueLen,"%02X",(ulong)*(byte *)((long)Data + local_50));
    }
    break;
  case 0x12:
    IntToString(Value,ValueLen,(uint)*Data,0);
    break;
  case 0x13:
    IntToString(Value,ValueLen,(int)*Data,0);
    break;
  case 0x14:
  case 0x21:
  case 0x22:
    IntToString(Value,ValueLen,*Data,(long)(int)(uint)((f.Den & 0x1f000000U) == 0x10000000));
    break;
  case 0x15:
    Int64ToString(Value,ValueLen,*Data,(long)(int)(uint)((f.Den & 0x1f000000U) == 0x10000000));
    break;
  case 0x19:
    PinToString(Value,ValueLen,(pin *)Data);
    break;
  case 0x23:
    GUIDToString(Value,ValueLen,(cc_guid *)Data);
    break;
  case 0x24:
    i = (size_t)*Data;
    f.Num = 0x10000;
    FractionToString(Value,ValueLen,(cc_fraction *)&i,0,3);
    break;
  case 0x29:
    Int64ToString(Value,ValueLen,*Data,0);
  }
  return 1;
}

Assistant:

NOINLINE bool_t DataToString(tchar_t* Value, size_t ValueLen, const void* Data, size_t Size, dataflags Type)
{
    cc_fraction f;
    size_t i;

    if (!Size)
        Size = NodeTypeSize(Type);

    if (Type & TFLAG_DEFAULT)
    {
        if ((Type & TYPE_MASK) == TYPE_STRING)
        {
            if (((const tchar_t*)Data)[0]==0)
                return 0;
        }
        else
        {
            for (i=0;i<Size;++i)
                if (((const uint8_t*)Data)[i])
                    break;
            if (i==Size)
                return 0;
        }
    }

    Value[0] = 0;

    switch (Type & TYPE_MASK)
    {
    case TYPE_BINARY:
           for (i=0;i<Size;++i)
            stcatprintf_s(Value,ValueLen,T("%02X"),((uint8_t*)Data)[i]);
        break;

    case TYPE_RGB:
        RGBToString(Value,ValueLen,*(rgbval_t*)Data);
        break;

    case TYPE_SIZE:
#if SIZE_MAX > INT32_MAX
        Int64ToString(Value,ValueLen,*(size_t*)Data,0);
#else
        IntToString(Value,ValueLen,*(size_t*)Data,0);
#endif
        break;

    case TYPE_INT:
        if ((Type & TUNIT_MASK)==TUNIT_PERCENT)
        {
            f.Num = *(int*)Data;
            f.Den = PERCENT_ONE;
            FractionToString(Value,ValueLen,&f,-1,1);
        }
        else
        {
            IntToString(Value,ValueLen,*(int*)Data,0);
        }
        break;

    case TYPE_INT8:
        IntToString(Value,ValueLen,*(uint8_t*)Data,0);
        break;

    case TYPE_INT16:
        IntToString(Value,ValueLen,*(int16_t*)Data,0);
        break;

    case TYPE_GUID:
        GUIDToString(Value,ValueLen,(const cc_guid*)Data);
        break;

    case TYPE_DBNO: //TODO: support for 64 bits
    case TYPE_DATETIME:
    case TYPE_INT32:
        IntToString(Value,ValueLen,*(int32_t*)Data,(Type & TUNIT_MASK)==TUNIT_HEX);
        break;

    case TYPE_INT64:
        Int64ToString(Value,ValueLen,*(int64_t*)Data,(Type & TUNIT_MASK)==TUNIT_HEX);
        break;

    case TYPE_BOOL_BIT:
    case TYPE_BOOLEAN:
        IntToString(Value,ValueLen,(int32_t)*(bool_t*)Data,0);
        break;

    case TYPE_FOURCC:
        FourCCToString(Value,ValueLen,*(fourcc_t*)Data);
        break;

    case TYPE_POINT:
        stprintf_s(Value,ValueLen,T("%d,%d"),((cc_point*)Data)->x,((cc_point*)Data)->y);
        break;

    case TYPE_RECT:
        stprintf_s(Value,ValueLen,T("%d,%d,%d,%d"),((cc_rect*)Data)->x,((cc_rect*)Data)->y,((cc_rect*)Data)->Width,((cc_rect*)Data)->Height);
        break;

    case TYPE_FIX16:
        f.Num = *(int*)Data;
        f.Den = FIX16_UNIT;
        FractionToString(Value,ValueLen,&f,0,3);
        break;

    case TYPE_FRACTION:
        if ((Type & TUNIT_MASK)==TUNIT_PERCENT)
            FractionToString(Value,ValueLen,(cc_fraction*)Data,-1,2);
        else
            stprintf_s(Value,ValueLen,T("%d:%d"),((cc_fraction*)Data)->Num,((cc_fraction*)Data)->Den);
        break;

    case TYPE_PIN:
        PinToString(Value,ValueLen,(pin*)Data);
        break;

    case TYPE_NODE:
        NodeToString(Value,ValueLen,*(node**)Data);
        break;

    case TYPE_STRING:
        tcscpy_s(Value,ValueLen,(tchar_t*)Data);
        break;
    }

    return 1;
}